

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O3

uint32_t __thiscall cfd::Psbt::AddTxIn(Psbt *this,OutPoint *outpoint,uint32_t sequence)

{
  uint32_t uVar1;
  Txid local_38;
  
  core::OutPoint::GetTxid(&local_38,outpoint);
  uVar1 = core::OutPoint::GetVout(outpoint);
  uVar1 = core::Psbt::AddTxIn(&this->super_Psbt,&local_38,uVar1,sequence);
  local_38._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
  if (local_38.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return uVar1;
}

Assistant:

uint32_t Psbt::AddTxIn(const OutPoint& outpoint, uint32_t sequence) {
  return cfd::core::Psbt::AddTxIn(
      outpoint.GetTxid(), outpoint.GetVout(), sequence);
}